

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LArNESTFluctuationBenchmarks.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  VDetector *detector;
  RandomGen *this;
  ostream *poVar2;
  size_t i;
  long lVar3;
  long *plVar4;
  size_type sVar5;
  double *pdVar6;
  long lVar7;
  LArNESTResult *pLVar8;
  pointer pdVar9;
  ulong uVar10;
  pointer pdVar11;
  uint64_t s;
  pointer pdVar12;
  pointer pdVar13;
  byte bVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  undefined1 auVar18 [16];
  double dVar19;
  double dVar20;
  double dVar21;
  initializer_list<NEST::LArInteraction> __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  vector<double,_std::allocator<double>_> electric_field;
  vector<double,_std::allocator<double>_> energy_vals;
  vector<double,_std::allocator<double>_> Nion;
  vector<double,_std::allocator<double>_> Nex;
  vector<double,_std::allocator<double>_> Ne;
  vector<double,_std::allocator<double>_> Nph;
  vector<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_> particle_types;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  particle_type;
  ofstream output_file;
  LArNEST larnest;
  long local_958;
  void *local_928;
  void *pvStack_920;
  long local_918;
  vector<double,_std::allocator<double>_> local_908;
  ulong local_8f0;
  double local_8e8;
  double dStack_8e0;
  double local_8d8;
  double local_8d0;
  size_type local_8c8;
  vector<double,_std::allocator<double>_> local_8c0;
  vector<double,_std::allocator<double>_> local_8a8;
  vector<double,_std::allocator<double>_> local_890;
  vector<double,_std::allocator<double>_> local_878;
  vector<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_> local_860;
  double local_848;
  double local_840;
  double local_838;
  double local_830;
  double local_828;
  ulong local_820;
  LArNESTResult local_818;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_798;
  long local_780;
  filebuf local_778 [240];
  ios_base local_688 [264];
  undefined1 local_580 [32];
  undefined1 *local_560;
  undefined1 local_550 [16];
  long *local_540 [2];
  long local_530 [160];
  
  bVar14 = 0;
  if (argc < 2) {
    local_828 = 1.393;
  }
  else {
    local_828 = atof(argv[1]);
  }
  if (argc < 3) {
    s = 0;
  }
  else {
    iVar1 = atoi(argv[2]);
    s = (uint64_t)iVar1;
  }
  local_8c8 = 100;
  if (3 < argc) {
    iVar1 = atoi(argv[3]);
    local_8c8 = (size_type)iVar1;
  }
  local_908.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_908.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_908.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  lVar3 = 0;
  do {
    local_580._0_8_ = (double)lVar3 * 0.019998 + 0.1;
    if (local_908.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_908.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (&local_908,
                 (iterator)
                 local_908.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish,(double *)local_580);
    }
    else {
      *local_908.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_finish = (double)local_580._0_8_;
      local_908.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_908.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1;
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 50000);
  local_580._0_8_ = (pointer)0x100000000;
  local_580._8_4_ = 2;
  __l._M_len = 3;
  __l._M_array = (iterator)local_580;
  std::vector<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_>::vector
            (&local_860,__l,(allocator_type *)&local_780);
  local_580._0_8_ = local_580 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_580,"NR","");
  local_560 = local_550;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_560,"ER","");
  plVar4 = local_530;
  local_540[0] = plVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"Alpha","");
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)local_580;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_798,__l_00,(allocator_type *)&local_780);
  lVar3 = -0x60;
  do {
    if (plVar4 != (long *)plVar4[-2]) {
      operator_delete((long *)plVar4[-2],*plVar4 + 1);
    }
    plVar4 = plVar4 + -4;
    lVar3 = lVar3 + 0x20;
  } while (lVar3 != 0);
  detector = (VDetector *)operator_new(0x128);
  LArDetector::LArDetector((LArDetector *)detector);
  sVar5 = local_8c8;
  NEST::LArNEST::LArNEST((LArNEST *)local_580,detector);
  this = RandomGen::rndm();
  RandomGen::SetSeed(this,s);
  std::ofstream::ofstream(&local_780);
  std::ofstream::open((char *)&local_780,0x117274);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_780,
             "type,energy,efield,TotalYield,QuantaYield,LightYield,Nph,Ne,Nex,Nion,TotalYield_std,QuantaYield_std,LightYield_std,Nph_std,Ne_std,Nex_std,Nion_std\n"
             ,0x93);
  if (local_860.super__Vector_base<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      local_860.super__Vector_base<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    pdVar9 = (pointer)0x0;
    pdVar11 = (pointer)0x0;
  }
  else {
    auVar18._8_4_ = (int)(sVar5 >> 0x20);
    auVar18._0_8_ = sVar5;
    auVar18._12_4_ = 0x45300000;
    dStack_8e0 = auVar18._8_8_ - 1.9342813113834067e+25;
    local_8e8 = dStack_8e0 + ((double)CONCAT44(0x43300000,(int)sVar5) - 4503599627370496.0);
    uVar10 = 0;
    pdVar11 = (pointer)0x0;
    pdVar9 = (pointer)0x0;
    do {
      local_928 = (void *)0x0;
      pvStack_920 = (void *)0x0;
      local_918 = 0;
      if (local_860.super__Vector_base<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar10] == ER) {
        pdVar6 = (double *)&DAT_001171b8;
        pLVar8 = &local_818;
        for (lVar3 = 10; lVar3 != 0; lVar3 = lVar3 + -1) {
          (pLVar8->yields).TotalYield = *pdVar6;
          pdVar6 = pdVar6 + (ulong)bVar14 * -2 + 1;
          pLVar8 = (LArNESTResult *)((long)pLVar8 + ((ulong)bVar14 * -2 + 1) * 8);
        }
        std::vector<double,std::allocator<double>>::_M_range_insert<double_const*>
                  ((vector<double,std::allocator<double>> *)&local_928,0,&local_818,
                   &local_818.fluctuations.NeFluctuation);
      }
      else if (local_860.
               super__Vector_base<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar10] == NR) {
        pdVar6 = (double *)&DAT_00117168;
        pLVar8 = &local_818;
        for (lVar3 = 10; lVar3 != 0; lVar3 = lVar3 + -1) {
          (pLVar8->yields).TotalYield = *pdVar6;
          pdVar6 = pdVar6 + (ulong)bVar14 * -2 + 1;
          pLVar8 = (LArNESTResult *)((long)pLVar8 + ((ulong)bVar14 * -2 + 1) * 8);
        }
        std::vector<double,std::allocator<double>>::_M_range_insert<double_const*>
                  ((vector<double,std::allocator<double>> *)&local_928,0,&local_818,
                   &local_818.fluctuations.NeFluctuation);
      }
      else {
        local_818.yields.Nion = 10000.0;
        local_818.yields.Lindhard = 20000.0;
        local_818.yields.Ne = 1000.0;
        local_818.yields.Nex = 5000.0;
        local_818.yields.LightYield = 100.0;
        local_818.yields.Nph = 500.0;
        local_818.yields.TotalYield = 1.0;
        local_818.yields.QuantaYield = 50.0;
        std::vector<double,std::allocator<double>>::_M_range_insert<double_const*>
                  ((vector<double,std::allocator<double>> *)&local_928,0,&local_818,
                   &local_818.yields.ElectricField);
      }
      if (pvStack_920 != local_928) {
        local_8f0 = 0;
        local_820 = uVar10;
        do {
          local_958 = 0;
          do {
            std::vector<double,_std::allocator<double>_>::vector
                      (&local_878,sVar5,(allocator_type *)&local_818);
            std::vector<double,_std::allocator<double>_>::vector
                      (&local_890,sVar5,(allocator_type *)&local_818);
            std::vector<double,_std::allocator<double>_>::vector
                      (&local_8a8,sVar5,(allocator_type *)&local_818);
            std::vector<double,_std::allocator<double>_>::vector
                      (&local_8c0,sVar5,(allocator_type *)&local_818);
            if (sVar5 != 0) {
              sVar5 = 0;
              pdVar12 = pdVar9;
              pdVar13 = pdVar11;
              do {
                NEST::LArNEST::FullCalculation
                          (&local_818,(LArNEST *)local_580,
                           local_860.
                           super__Vector_base<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_>
                           ._M_impl.super__Vector_impl_data._M_start[local_820],
                           local_908.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[local_958],0.0,
                           *(double *)((long)local_928 + local_8f0 * 8),local_828,false);
                pdVar9 = local_818.photon_times.super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage;
                pdVar11 = local_818.photon_times.super__Vector_base<double,_std::allocator<double>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                dVar16 = local_818.fluctuations.NionFluctuation;
                dVar15 = local_818.fluctuations.NexFluctuation;
                dVar19 = local_818.fluctuations.NeFluctuation;
                dVar21 = local_818.fluctuations.NphFluctuation;
                local_818.photon_times.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                local_818.photon_times.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                local_818.photon_times.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                if (pdVar13 != (pointer)0x0) {
                  operator_delete(pdVar13,(long)pdVar12 - (long)pdVar13);
                }
                if (local_818.photon_times.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_818.photon_times.
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_start,
                                  (long)local_818.photon_times.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_end_of_storage -
                                  (long)local_818.photon_times.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start);
                }
                local_878.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[sVar5] = dVar21;
                local_890.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[sVar5] = dVar19;
                local_8a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[sVar5] = dVar15;
                local_8c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[sVar5] = dVar16;
                sVar5 = sVar5 + 1;
                pdVar12 = pdVar9;
                pdVar13 = pdVar11;
              } while (local_8c8 != sVar5);
            }
            uVar10 = local_820;
            sVar5 = local_8c8;
            dVar21 = 0.0;
            for (pdVar6 = local_878.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start;
                pdVar6 != local_878.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish; pdVar6 = pdVar6 + 1) {
              dVar21 = dVar21 + *pdVar6;
            }
            dVar19 = 0.0;
            for (pdVar6 = local_890.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start;
                pdVar6 != local_890.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish; pdVar6 = pdVar6 + 1) {
              dVar19 = dVar19 + *pdVar6;
            }
            dVar15 = 0.0;
            for (pdVar6 = local_8a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start;
                pdVar6 != local_8a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish; pdVar6 = pdVar6 + 1) {
              dVar15 = dVar15 + *pdVar6;
            }
            dVar16 = 0.0;
            for (pdVar6 = local_8c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start;
                pdVar6 != local_8c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish; pdVar6 = pdVar6 + 1) {
              dVar16 = dVar16 + *pdVar6;
            }
            dVar21 = dVar21 / local_8e8;
            dVar19 = dVar19 / local_8e8;
            local_830 = dVar21 + dVar19;
            if ((long)local_878.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_878.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start == 0) {
              dVar17 = 0.0;
            }
            else {
              lVar3 = (long)local_878.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)local_878.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start >> 3;
              dVar17 = 0.0;
              lVar7 = 0;
              do {
                dVar20 = (local_878.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar7] +
                         local_890.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar7]) - local_830;
                dVar17 = dVar17 + dVar20 * dVar20;
                lVar7 = lVar7 + 1;
              } while (lVar3 + (ulong)(lVar3 == 0) != lVar7);
            }
            dVar17 = dVar17 / local_8e8;
            if (dVar17 < 0.0) {
              local_838 = sqrt(dVar17);
            }
            else {
              local_838 = SQRT(dVar17);
            }
            if ((long)local_878.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_878.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start == 0) {
              dVar17 = 0.0;
            }
            else {
              lVar3 = (long)local_878.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)local_878.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start >> 3;
              dVar17 = 0.0;
              lVar7 = 0;
              do {
                dVar17 = dVar17 + (local_878.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start[lVar7] - dVar21) *
                                  (local_878.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start[lVar7] - dVar21);
                lVar7 = lVar7 + 1;
              } while (lVar3 + (ulong)(lVar3 == 0) != lVar7);
            }
            dVar17 = dVar17 / local_8e8;
            if (dVar17 < 0.0) {
              local_8d0 = sqrt(dVar17);
            }
            else {
              local_8d0 = SQRT(dVar17);
            }
            if ((long)local_890.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_890.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start == 0) {
              dVar17 = 0.0;
            }
            else {
              lVar3 = (long)local_890.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)local_890.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start >> 3;
              dVar17 = 0.0;
              lVar7 = 0;
              do {
                dVar17 = dVar17 + (local_890.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start[lVar7] - dVar19) *
                                  (local_890.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_start[lVar7] - dVar19);
                lVar7 = lVar7 + 1;
              } while (lVar3 + (ulong)(lVar3 == 0) != lVar7);
            }
            dVar17 = dVar17 / local_8e8;
            if (dVar17 < 0.0) {
              local_8d8 = sqrt(dVar17);
            }
            else {
              local_8d8 = SQRT(dVar17);
            }
            dVar15 = dVar15 / local_8e8;
            if ((long)local_8a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_8a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start == 0) {
              dVar17 = 0.0;
            }
            else {
              lVar3 = (long)local_8a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)local_8a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start >> 3;
              dVar17 = 0.0;
              lVar7 = 0;
              do {
                dVar20 = local_8a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar7] - dVar15;
                dVar17 = dVar17 + dVar20 * dVar20;
                lVar7 = lVar7 + 1;
              } while (lVar3 + (ulong)(lVar3 == 0) != lVar7);
            }
            dVar17 = dVar17 / local_8e8;
            if (dVar17 < 0.0) {
              local_840 = sqrt(dVar17);
            }
            else {
              local_840 = SQRT(dVar17);
            }
            dVar16 = dVar16 / local_8e8;
            if ((long)local_8c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_8c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start == 0) {
              dVar17 = 0.0;
            }
            else {
              lVar3 = (long)local_8c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)local_8c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start >> 3;
              dVar17 = 0.0;
              lVar7 = 0;
              do {
                dVar20 = local_8c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar7] - dVar16;
                dVar17 = dVar17 + dVar20 * dVar20;
                lVar7 = lVar7 + 1;
              } while (lVar3 + (ulong)(lVar3 == 0) != lVar7);
            }
            dVar17 = dVar17 / local_8e8;
            if (dVar17 < 0.0) {
              local_848 = sqrt(dVar17);
            }
            else {
              local_848 = SQRT(dVar17);
            }
            poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&local_780,
                                local_798.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar10]._M_dataplus._M_p,
                                local_798.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar10]._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,",",1);
            poVar2 = std::ostream::_M_insert<double>
                               (local_908.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start[local_958]);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,",",1);
            poVar2 = std::ostream::_M_insert<double>(*(double *)((long)local_928 + local_8f0 * 8));
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,",",1);
            poVar2 = std::ostream::_M_insert<double>
                               (local_830 /
                                local_908.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start[local_958]);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,",",1);
            poVar2 = std::ostream::_M_insert<double>
                               (dVar19 / local_908.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_start[local_958]);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,",",1);
            poVar2 = std::ostream::_M_insert<double>
                               (dVar21 / local_908.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_start[local_958]);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,",",1);
            poVar2 = std::ostream::_M_insert<double>(dVar21);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,",",1);
            poVar2 = std::ostream::_M_insert<double>(dVar19);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,",",1);
            poVar2 = std::ostream::_M_insert<double>(dVar15);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,",",1);
            poVar2 = std::ostream::_M_insert<double>(dVar16);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,",",1);
            poVar2 = std::ostream::_M_insert<double>
                               (local_838 /
                                local_908.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start[local_958]);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,",",1);
            poVar2 = std::ostream::_M_insert<double>
                               (local_8d8 /
                                local_908.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start[local_958]);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,",",1);
            poVar2 = std::ostream::_M_insert<double>
                               (local_8d0 /
                                local_908.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start[local_958]);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,",",1);
            poVar2 = std::ostream::_M_insert<double>(local_8d0);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,",",1);
            poVar2 = std::ostream::_M_insert<double>(local_8d8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,",",1);
            poVar2 = std::ostream::_M_insert<double>(local_840);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,",",1);
            poVar2 = std::ostream::_M_insert<double>(local_848);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
            if (local_8c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start != (double *)0x0) {
              operator_delete(local_8c0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_8c0.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_8c0.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_8a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start != (double *)0x0) {
              operator_delete(local_8a8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_8a8.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_8a8.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_890.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start != (double *)0x0) {
              operator_delete(local_890.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_890.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_890.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_878.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start != (double *)0x0) {
              operator_delete(local_878.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_878.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_878.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            local_958 = local_958 + 1;
          } while (local_958 != 50000);
          local_8f0 = local_8f0 + 1;
        } while (local_8f0 < (ulong)((long)pvStack_920 - (long)local_928 >> 3));
      }
      if (local_928 != (void *)0x0) {
        operator_delete(local_928,local_918 - (long)local_928);
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 < (ulong)((long)local_860.
                                    super__Vector_base<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_860.
                                    super__Vector_base<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 2));
  }
  std::ofstream::close();
  local_780 = _VTT;
  *(undefined8 *)(local_778 + *(long *)(_VTT + -0x18) + -8) = _sqrt;
  std::filebuf::~filebuf(local_778);
  std::ios_base::~ios_base(local_688);
  if (pdVar11 != (pointer)0x0) {
    operator_delete(pdVar11,(long)pdVar9 - (long)pdVar11);
  }
  NEST::LArNEST::~LArNEST((LArNEST *)local_580);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_798);
  if (local_860.super__Vector_base<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_860.
                    super__Vector_base<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_860.
                          super__Vector_base<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_860.
                          super__Vector_base<NEST::LArInteraction,_std::allocator<NEST::LArInteraction>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_908.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_908.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_908.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_908.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
  // this sample program takes can take two arguments,
  // (optional) 1) density - the density of the LAr to use
  // (optional) 2) seed - a seed for the random number generator

  double density = 1.393;
  uint64_t seed = 0;
  uint64_t num_events = 100;
  if (argc > 1) {
    density = atof(argv[1]);
  }
  if (argc > 2) {
    seed = atoi(argv[2]);
  }
  if (argc > 3) {
    num_events = atoi(argv[3]);
  }

  // set up energy steps
  int num_energy_steps = 50000;
  std::vector<double> energy_vals;
  double start_val = .1;
  double end_val = 1000;
  double step_size = (end_val - start_val) / num_energy_steps;

  for (size_t i = 0; i < num_energy_steps; i++) {
    energy_vals.emplace_back(start_val + step_size * i);
  }
  std::vector<NEST::LArInteraction> particle_types = {
      NEST::LArInteraction::NR, NEST::LArInteraction::ER,
      NEST::LArInteraction::Alpha};
  std::vector<std::string> particle_type = {"NR", "ER", "Alpha"};

  LArDetector* detector = new LArDetector();
  // Construct NEST class using detector object
  NEST::LArNEST larnest(detector);
  // Set random seed of RandomGen class
  RandomGen::rndm()->SetSeed(seed);

  // Construct NEST objects for storing calculation results
  NEST::LArNESTResult result;
  std::ofstream output_file;

  output_file.open("fluctuation_benchmarks.csv");
  output_file << "type,energy,efield,TotalYield,QuantaYield,LightYield,Nph,Ne,"
                 "Nex,Nion,TotalYield_std,QuantaYield_std,LightYield_std,Nph_"
                 "std,Ne_std,Nex_std,Nion_std\n";

  // iterate over electric field values
  for (size_t k = 0; k < particle_types.size(); k++) {
    std::vector<double> electric_field;
    if (particle_types[k] == NEST::LArInteraction::NR) {
      electric_field.insert(electric_field.end(), {1, 50, 100, 200, 250, 500,
                                                   1000, 1500, 1750, 2000});
    } else if (particle_types[k] == NEST::LArInteraction::ER) {
      electric_field.insert(electric_field.end(), {1, 100, 200, 600, 1000, 1500,
                                                   2500, 6000, 9000, 9500});
    } else {
      electric_field.insert(electric_field.end(),
                            {1, 50, 100, 500, 1000, 5000, 10000, 20000});
    }
    // iterate over number of events
    for (size_t v = 0; v < electric_field.size(); v++) {
      for (size_t i = 0; i < num_energy_steps; i++) {
        std::vector<double> Nph(num_events);
        std::vector<double> Ne(num_events);
        std::vector<double> Nex(num_events);
        std::vector<double> Nion(num_events);
        // collect statistics for each event
        for (size_t j = 0; j < num_events; j++) {
          result = larnest.FullCalculation(particle_types[k], energy_vals[i], 0,
                                           electric_field[v], density, false);
          Nph[j] = double(result.fluctuations.NphFluctuation);
          Ne[j] = double(result.fluctuations.NeFluctuation);
          Nex[j] = double(result.fluctuations.NexFluctuation);
          Nion[j] = double(result.fluctuations.NionFluctuation);
        }
        double Nph_mean =
            std::accumulate(Nph.begin(), Nph.end(), 0.0) / double(num_events);
        double Ne_mean =
            std::accumulate(Ne.begin(), Ne.end(), 0.0) / double(num_events);
        double Nex_mean =
            std::accumulate(Nex.begin(), Nex.end(), 0.0) / double(num_events);
        double Nion_mean =
            std::accumulate(Nion.begin(), Nion.end(), 0.0) / double(num_events);

        double Nq_mean = Nph_mean + Ne_mean;
        double Nq_std = 0.0;
        double Nph_std = 0.0;
        double Ne_std = 0.0;
        double Nex_std = 0.0;
        double Nion_std = 0.0;

        for (size_t ii = 0; ii < Nph.size(); ii++) {
          Nq_std += (Nph[ii] + Ne[ii] - Nq_mean) * (Nph[ii] + Ne[ii] - Nq_mean);
        }
        Nq_std = std::sqrt(Nq_std / double(num_events));

        for (size_t ii = 0; ii < Nph.size(); ii++) {
          Nph_std += (Nph[ii] - Nph_mean) * (Nph[ii] - Nph_mean);
        }
        Nph_std = std::sqrt(Nph_std / double(num_events));

        for (size_t ii = 0; ii < Ne.size(); ii++) {
          Ne_std += (Ne[ii] - Ne_mean) * (Ne[ii] - Ne_mean);
        }
        Ne_std = std::sqrt(Ne_std / double(num_events));

        for (size_t ii = 0; ii < Nex.size(); ii++) {
          Nex_std += (Nex[ii] - Nex_mean) * (Nex[ii] - Nex_mean);
        }
        Nex_std = std::sqrt(Nex_std / double(num_events));

        for (size_t ii = 0; ii < Nion.size(); ii++) {
          Nion_std += (Nion[ii] - Nion_mean) * (Nion[ii] - Nion_mean);
        }
        Nion_std = std::sqrt(Nion_std / double(num_events));

        output_file << particle_type[k] << ",";
        output_file << energy_vals[i] << ",";
        output_file << electric_field[v] << ",";
        output_file << (Nq_mean / energy_vals[i]) << ",";
        output_file << (Ne_mean / energy_vals[i]) << ",";
        output_file << (Nph_mean / energy_vals[i]) << ",";
        output_file << Nph_mean << ",";
        output_file << Ne_mean << ",";
        output_file << Nex_mean << ",";
        output_file << Nion_mean << ",";
        output_file << (Nq_std / energy_vals[i]) << ",";
        output_file << (Ne_std / energy_vals[i]) << ",";
        output_file << (Nph_std / energy_vals[i]) << ",";
        output_file << Nph_std << ",";
        output_file << Ne_std << ",";
        output_file << Nex_std << ",";
        output_file << Nion_std << "\n";
      }
    }
  }
  output_file.close();
  return 0;
}